

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,string *config,bool forResponseFile)

{
  cmMakefile *pcVar1;
  byte bVar2;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmLocalGenerator_cxx:269:5)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmLocalGenerator_cxx:269:5)>
  __comp_00;
  cmGeneratorTarget *this_00;
  pointer __last;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  string *psVar6;
  undefined8 uVar7;
  pointer pbVar8;
  string *psVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  string_view str;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  string_view source;
  string flags;
  string sep;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  ostringstream includeFlags;
  string local_308;
  cmLocalGenerator *local_2e8;
  OutputFormat local_2dc;
  string local_2d8;
  string local_2b8;
  string *local_298;
  string *local_290;
  string *local_288;
  string *local_280;
  undefined8 local_278;
  string *local_270;
  string *local_268;
  string *local_260;
  string *local_258;
  cmGeneratorTarget *local_250;
  undefined1 local_248 [8];
  undefined1 auStack_240 [8];
  _Rb_tree_node_base local_238;
  undefined8 local_218;
  char *local_210;
  undefined8 local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  string local_1e8;
  string *local_1c8;
  string *local_1c0;
  string *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_2e8 = this;
  local_290 = config;
  if (lang->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_200,includeDirs);
    __last = local_200.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = local_200.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2b8._M_dataplus._M_p = (pointer)target;
    if (target != (cmGeneratorTarget *)0x0) {
      local_248 = (undefined1  [8])&local_2b8;
      auStack_240 = (undefined1  [8])local_290;
      local_238._0_8_ = lang;
      if (local_200.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_200.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar4 = (long)local_200.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_200.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1a8,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )local_200.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._16_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          __comp_00._M_comp.config = (string *)auStack_240;
          __comp_00._M_comp.target = (cmGeneratorTarget **)local_248;
          __comp_00._M_comp.lang = (string *)local_238._0_8_;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )__last,__comp_00);
        }
        else {
          __comp._M_comp.config = (string *)auStack_240;
          __comp._M_comp.target = (cmGeneratorTarget **)local_248;
          __comp._M_comp.lang = (string *)local_238._0_8_;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )__last,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8._16_8_,local_1a8._8_8_,__comp);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1a8);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar1 = local_2e8->Makefile;
    local_248 = (undefined1  [8])0x13;
    auStack_240 = (undefined1  [8])0x8aefbc;
    local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238._M_left = (_Base_ptr)(lang->_M_dataplus)._M_p;
    local_238._M_parent = (_Base_ptr)lang->_M_string_length;
    local_238._M_right = (_Base_ptr)0x0;
    views._M_len = 2;
    views._M_array = (iterator)local_248;
    cmCatViews(&local_2b8,views);
    local_250 = target;
    local_1c0 = cmMakefile::GetSafeDefinition(pcVar1,&local_2b8);
    if (local_2b8._M_dataplus._M_p != (pointer)((long)&local_2b8 + 0x10)) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = local_2e8->Makefile;
    local_248 = (undefined1  [8])&local_238;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"CMAKE_QUOTE_INCLUDE_PATHS","");
    local_258 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_248);
    if (local_248 != (undefined1  [8])&local_238) {
      operator_delete((void *)local_248,(ulong)(local_238._0_8_ + 1));
    }
    local_2b8._M_dataplus._M_p = (pointer)((long)&local_2b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8," ","");
    pcVar1 = local_2e8->Makefile;
    local_248 = (undefined1  [8])0x17;
    auStack_240 = (undefined1  [8])0x8aefea;
    local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238._M_left = (_Base_ptr)(lang->_M_dataplus)._M_p;
    local_238._M_parent = (_Base_ptr)lang->_M_string_length;
    local_238._M_right = (_Base_ptr)0x0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_248;
    cmCatViews(&local_308,views_00);
    local_1b8 = (string *)cmMakefile::GetDefinition(pcVar1,&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8 == (string *)0x0) {
      pcVar1 = local_2e8->Makefile;
      local_248 = (undefined1  [8])0x1a;
      auStack_240 = (undefined1  [8])0x8af003;
      local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_238._M_left = (_Base_ptr)(lang->_M_dataplus)._M_p;
      local_238._M_parent = (_Base_ptr)lang->_M_string_length;
      local_238._M_right = (_Base_ptr)0x0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_248;
      cmCatViews(&local_308,views_01);
      local_298 = (string *)cmMakefile::GetDefinition(pcVar1,&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = local_2e8->Makefile;
      local_248 = (undefined1  [8])0x1b;
      auStack_240 = (undefined1  [8])0x8af002;
      local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_238._M_left = (_Base_ptr)(lang->_M_dataplus)._M_p;
      local_238._M_parent = (_Base_ptr)lang->_M_string_length;
      local_238._M_right = (_Base_ptr)0x0;
      local_218 = 8;
      local_210 = "_WARNING";
      local_208 = 0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_248;
      cmCatViews(&local_308,views_02);
      local_280 = (string *)cmMakefile::GetDefinition(pcVar1,&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_2b8);
      local_280 = (string *)0x0;
      local_298 = (string *)0x0;
    }
    pcVar1 = local_2e8->Makefile;
    local_248 = (undefined1  [8])0x6;
    auStack_240 = (undefined1  [8])0x8b9254;
    local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238._M_left = (_Base_ptr)(lang->_M_dataplus)._M_p;
    local_238._M_parent = (_Base_ptr)lang->_M_string_length;
    local_238._M_right = (_Base_ptr)0x0;
    local_218 = 0x16;
    local_210 = "_FRAMEWORK_SEARCH_FLAG";
    local_208 = 0;
    views_03._M_len = 3;
    views_03._M_array = (iterator)local_248;
    cmCatViews(&local_308,views_03);
    local_288 = (string *)cmMakefile::GetDefinition(pcVar1,&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = local_2e8->Makefile;
    local_248 = (undefined1  [8])0x6;
    auStack_240 = (undefined1  [8])0x8b9254;
    local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238._M_left = (_Base_ptr)(lang->_M_dataplus)._M_p;
    local_238._M_parent = (_Base_ptr)lang->_M_string_length;
    local_238._M_right = (_Base_ptr)0x0;
    local_218 = 0x1d;
    local_210 = "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
    local_208 = 0;
    views_04._M_len = 3;
    views_04._M_array = (iterator)local_248;
    cmCatViews(&local_308,views_04);
    local_270 = (string *)cmMakefile::GetDefinition(pcVar1,&local_308);
    psVar9 = local_288;
    local_260 = lang;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    local_238._M_parent = (_Base_ptr)auStack_240;
    auStack_240 = (undefined1  [8])((ulong)auStack_240 & 0xffffffff00000000);
    local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238._M_right = (_Base_ptr)0x0;
    local_1b0 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = 0;
    local_238._M_left = local_238._M_parent;
    if (local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar10 = local_298 == (string *)0x0;
      bVar11 = local_250 == (cmGeneratorTarget *)0x0;
      bVar12 = local_270 == (string *)0x0;
      local_268 = psVar9;
      if (psVar9 == (string *)0x0) {
        local_268 = &cmValue::Empty_abi_cxx11_;
      }
      local_2dc = (uint)forResponseFile * 2;
      bVar2 = 0;
      local_278 = 0;
      pbVar8 = local_200.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1c8 = __return_storage_ptr__;
      do {
        if (psVar9 == (string *)0x0) {
          bVar13 = false;
        }
        else {
          bVar13 = psVar9->_M_string_length != 0;
        }
        if (bVar13) {
          pcVar1 = local_2e8->Makefile;
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"APPLE","");
          bVar3 = cmMakefile::IsOn(pcVar1,&local_308);
          if (!bVar3) goto LAB_002da86b;
          bVar3 = cmSystemTools::IsPathToFramework(pbVar8);
        }
        else {
LAB_002da86b:
          bVar3 = false;
        }
        this_00 = local_250;
        if ((bVar13) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2)) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        psVar9 = local_288;
        if (bVar3 == false) {
          if (!(bool)(local_1b8 != (string *)0x0 & bVar2)) {
            if ((bVar10 || bVar11) ||
               (bVar13 = cmGeneratorTarget::IsSystemIncludeDirectory
                                   (this_00,pbVar8,local_290,local_260), !bVar13)) {
              bVar2 = 1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_1c0->_M_dataplus)._M_p,
                         local_1c0->_M_string_length);
            }
            else {
              local_278 = CONCAT71((int7)((ulong)local_298 >> 8),1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_298->_M_dataplus)._M_p,
                         (long)((_Alloc_hider *)&local_298->_M_string_length)->_M_p);
              bVar2 = 1;
            }
          }
          (*(local_2e8->super_cmOutputConverter)._vptr_cmOutputConverter[0x13])
                    (&local_2d8,local_2e8,pbVar8,(ulong)local_2dc);
          if (((local_258 != (string *)0x0) && (local_2d8._M_string_length != 0)) &&
             (*local_2d8._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
          if (((local_258 != (string *)0x0) && (local_2d8._M_string_length != 0)) &&
             (*local_2d8._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_2d8,pbVar8);
          psVar9 = local_288;
          pVar14 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_248,&local_2d8);
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if ((bVar12 || bVar11) ||
               (bVar13 = cmGeneratorTarget::IsSystemIncludeDirectory
                                   (this_00,&local_2d8,local_290,local_260), psVar6 = local_270,
               !bVar13)) {
              psVar6 = local_268;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
            source._M_str = local_2d8._M_dataplus._M_p;
            source._M_len = local_2d8._M_string_length;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                      (&local_1e8,&local_2e8->super_cmOutputConverter,source,local_2dc,false);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                                local_1e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        pbVar8 = pbVar8 + 1;
        uVar7 = local_278;
        __return_storage_ptr__ = local_1c8;
      } while (pbVar8 != local_1b0);
    }
    if (((byte)uVar7 & local_280 != (string *)0x0) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(local_280->_M_dataplus)._M_p,local_280->_M_string_length);
    }
    std::__cxx11::stringbuf::str();
    if (((*local_2b8._M_dataplus._M_p != ' ') && (local_2d8._M_string_length != 0)) &&
       (local_2d8._M_dataplus._M_p[local_2d8._M_string_length - 1] == *local_2b8._M_dataplus._M_p))
    {
      local_2d8._M_dataplus._M_p[local_2d8._M_string_length - 1] = ' ';
    }
    str._M_str = local_2d8._M_dataplus._M_p;
    str._M_len = local_2d8._M_string_length;
    cmTrimWhitespace_abi_cxx11_(__return_storage_ptr__,str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
    if (local_2b8._M_dataplus._M_p != (pointer)((long)&local_2b8 + 0x10)) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_200);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  std::vector<std::string> const& includeDirs, cmGeneratorTarget* target,
  std::string const& lang, std::string const& config, bool forResponseFile)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string const& includeFlag =
    this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  std::string sep = " ";
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (cmValue incSep = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_INCLUDE_FLAG_SEP_", lang))) {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    sep = *incSep;
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  cmValue sysIncludeFlag = nullptr;
  cmValue sysIncludeFlagWarning = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));
    sysIncludeFlagWarning = this->Makefile->GetDefinition(
      cmStrCat("_CMAKE_INCLUDE_SYSTEM_FLAG_", lang, "_WARNING"));
  }

  cmValue fwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_FRAMEWORK_SEARCH_FLAG"));
  cmValue sysFwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_SYSTEM_FRAMEWORK_SEARCH_FLAG"));

  bool flagUsed = false;
  bool sysIncludeFlagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (cmNonempty(fwSearchFlag) && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string const frameworkDir = cmSystemTools::GetFilenamePath(i);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(frameworkDir, config, lang)) {
          includeFlags << *sysFwSearchFlag;
        } else {
          includeFlags << *fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << *sysIncludeFlag;
        sysIncludeFlagUsed = true;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath = this->ConvertToIncludeReference(i, shellFormat);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  if (sysIncludeFlagUsed && sysIncludeFlagWarning) {
    includeFlags << *sysIncludeFlagWarning;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return cmTrimWhitespace(flags);
}